

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O2

int Ssc_GiaSimClassRefineOne(Gia_Man_t *p,int i)

{
  Vec_Int_t **ppVVar1;
  word *pwVar2;
  ulong *puVar3;
  word *pwVar4;
  ulong *puVar5;
  Vec_Int_t *p_00;
  int iVar6;
  int iVar7;
  word *pwVar8;
  word *pwVar9;
  Vec_Int_t **ppVVar10;
  ulong uVar11;
  ulong uVar12;
  int local_3c;
  
  ppVVar1 = &p->vClassNew;
  local_3c = 0;
  do {
    iVar6 = Gia_ObjIsHead(p,i);
    if (iVar6 == 0) {
      __assert_fail("Gia_ObjIsHead( p, i )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                    ,0xc9,"int Ssc_GiaSimClassRefineOne(Gia_Man_t *, int)");
    }
    p_00 = p->vClassOld;
    p_00->nSize = 0;
    p->vClassNew->nSize = 0;
    Vec_IntPush(p_00,i);
    Gia_ManObj(p,i);
    iVar7 = Gia_ObjIsHead(p,i);
    iVar6 = i;
    if (iVar7 == 0) {
      __assert_fail("Gia_ObjIsHead(p, i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                    ,0xce,"int Ssc_GiaSimClassRefineOne(Gia_Man_t *, int)");
    }
    while (iVar6 = p->pNexts[iVar6], iVar6 != 0) {
      uVar11 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
      uVar12 = uVar11 & 0xffffffff;
      pwVar8 = Gia_ObjSim(p,i);
      pwVar9 = Gia_ObjSim(p,iVar6);
      if ((int)uVar11 < 1) {
        uVar12 = 0;
      }
      if ((((uint)*pwVar9 ^ (uint)*pwVar8) & 1) == 0) {
        uVar11 = 0;
        do {
          ppVVar10 = &p->vClassOld;
          if (uVar12 == uVar11) break;
          pwVar4 = pwVar8 + uVar11;
          pwVar2 = pwVar9 + uVar11;
          ppVVar10 = ppVVar1;
          uVar11 = uVar11 + 1;
        } while (*pwVar4 == *pwVar2);
      }
      else {
        uVar11 = 0;
        do {
          ppVVar10 = &p->vClassOld;
          if (uVar12 == uVar11) break;
          puVar3 = pwVar9 + uVar11;
          puVar5 = pwVar8 + uVar11;
          uVar11 = uVar11 + 1;
          ppVVar10 = ppVVar1;
        } while ((*puVar3 ^ *puVar5) == 0xffffffffffffffff);
      }
      Vec_IntPush(*ppVVar10,iVar6);
    }
    if ((*ppVVar1)->nSize == 0) {
      iVar6 = 0;
LAB_004c5050:
      return iVar6 + local_3c;
    }
    Ssc_GiaSimClassCreate(p,p->vClassOld);
    Ssc_GiaSimClassCreate(p,p->vClassNew);
    if (p->vClassNew->nSize < 2) {
      iVar6 = 1;
      goto LAB_004c5050;
    }
    i = Vec_IntEntry(p->vClassNew,0);
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int Ssc_GiaSimClassRefineOne( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    int Ent;
    assert( Gia_ObjIsHead( p, i ) );
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj = Gia_ManObj(p, i);
    Gia_ClassForEachObj1( p, i, Ent )
    {
        if ( Ssc_GiaSimAreEqual( p, i, Ent ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Ssc_GiaSimClassCreate( p, p->vClassOld );
    Ssc_GiaSimClassCreate( p, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Ssc_GiaSimClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}